

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>::disposeImpl
          (DisposableOwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_> *this,
          void *pointer)

{
  word *pwVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pwVar1 = (this->super_OwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>).
           super_OwnedBundle<kj::Array<capnp::word>_>.first.ptr;
  if (pwVar1 != (word *)0x0) {
    sVar2 = (this->super_OwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>).
            super_OwnedBundle<kj::Array<capnp::word>_>.first.size_;
    (this->super_OwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>).
    super_OwnedBundle<kj::Array<capnp::word>_>.first.ptr = (word *)0x0;
    (this->super_OwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>).
    super_OwnedBundle<kj::Array<capnp::word>_>.first.size_ = 0;
    pAVar3 = (this->super_OwnedBundle<capnp::AnyPointer::Reader_&,_kj::Array<capnp::word>_>).
             super_OwnedBundle<kj::Array<capnp::word>_>.first.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pwVar1,8,sVar2,sVar2,0);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }